

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void prof_butcher(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int npulse;
  int iVar2;
  OBJ_DATA *pOVar3;
  int *piVar4;
  OBJ_DATA *in_RSI;
  char_data *in_RDI;
  OBJ_DATA *meat;
  int i;
  int nummeat;
  OBJ_DATA *obj;
  int in_stack_0000007c;
  OBJ_INDEX_DATA *in_stack_00000080;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  OBJ_DATA *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffe4;
  
  if ((*(char *)&in_RSI->next == '\0') ||
     (pOVar3 = get_obj_here((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                            (char *)in_stack_ffffffffffffffd0), pOVar3 == (OBJ_DATA *)0x0)) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    return;
  }
  if (pOVar3->item_type != 0x17) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    return;
  }
  if (pOVar3->contains != (OBJ_DATA *)0x0) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    return;
  }
  act((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  act((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  extract_obj(in_RSI);
  iVar6 = 1;
  char_data::Profs(in_RDI);
  iVar1 = CProficiencies::GetProf
                    ((CProficiencies *)CONCAT44(in_stack_ffffffffffffffe4,iVar6),
                     (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  npulse = (iVar1 + 2) / 3;
  piVar4 = std::max<int>((int *)&stack0xffffffffffffffe0,(int *)&stack0xffffffffffffffdc);
  iVar1 = *piVar4;
  act((char *)CONCAT44(iVar1,iVar6),(CHAR_DATA *)CONCAT44(npulse,in_stack_ffffffffffffffd8),
      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  for (iVar5 = 0; iVar2 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20), iVar5 < iVar1;
      iVar5 = iVar5 + 1) {
    get_obj_index(npulse);
    in_stack_ffffffffffffffd0 = create_object(in_stack_00000080,in_stack_0000007c);
    obj_to_char(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    char_data::Profs(in_RDI);
    iVar2 = CProficiencies::GetProf
                      ((CProficiencies *)CONCAT44(iVar1,iVar6),(char *)CONCAT44(npulse,iVar5));
    in_stack_ffffffffffffffd0->value[0] = iVar2 + in_stack_ffffffffffffffd0->value[0];
    char_data::Profs(in_RDI);
    iVar2 = CProficiencies::GetProf
                      ((CProficiencies *)CONCAT44(iVar1,iVar6),(char *)CONCAT44(npulse,iVar5));
    in_stack_ffffffffffffffd0->value[1] = iVar2 + in_stack_ffffffffffffffd0->value[1];
    char_data::Profs(in_RDI);
    iVar2 = CProficiencies::GetProf
                      ((CProficiencies *)CONCAT44(iVar1,iVar6),(char *)CONCAT44(npulse,iVar5));
    in_stack_ffffffffffffffd0->timer = (short)(iVar2 << 1) + 0xc;
  }
  char_data::Profs(in_RDI);
  CProficiencies::CheckImprove
            ((CProficiencies *)CONCAT44(iVar1,iVar6),(char *)CONCAT44(npulse,iVar5),iVar2);
  WAIT_STATE((CHAR_DATA *)CONCAT44(iVar1,iVar6),npulse);
  return;
}

Assistant:

void prof_butcher(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;

	if (argument[0] == '\0' || !(obj = get_obj_here(ch, argument)))
	{
		send_to_char("You don't see that here.\n\r",ch);
		return;
	}

	if (obj->item_type != ITEM_CORPSE_NPC)
	{
		send_to_char("You can't butcher that.\n\r", ch);
		return;
	}

	if (obj->contains)
	{
		send_to_char("That corpse is too full to be gutted.\n\r", ch);
		return;
	}

	act("$n butchers $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks.", ch, obj, 0, TO_ROOM);
	act("You butcher $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks.", ch, obj, 0, TO_CHAR);

	extract_obj(obj);

	int nummeat = std::max(1, (ch->Profs()->GetProf("butchery") + 2) / 3);
	act("After the butchering process, you are left with $i pieces of meat.", ch, &nummeat, 0, TO_CHAR);

	for (auto i = 0; i < nummeat; i++)
	{
		auto meat = create_object(get_obj_index(OBJ_VNUM_MEAT_CHUNKS), ch->level);
		obj_to_char(meat, ch);
		meat->value[0] += ch->Profs()->GetProf("butchery");
		meat->value[1] += ch->Profs()->GetProf("butchery");
		meat->timer = 12 + ch->Profs()->GetProf("butchery") * 2;
	}

	ch->Profs()->CheckImprove("butchery", 100);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}